

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::Logging::formatInstruction
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Detail *detail,Operand_ *opArray,uint32_t opCount)

{
  Error EVar1;
  Operand_ *in_stack_000000b0;
  Detail *in_stack_000000b8;
  uint32_t in_stack_000000c4;
  CodeEmitter *in_stack_000000c8;
  uint32_t in_stack_000000d4;
  StringBuilder *in_stack_000000d8;
  uint32_t in_stack_00000500;
  
  EVar1 = X86Logging::formatInstruction
                    (in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c4,
                     in_stack_000000b8,in_stack_000000b0,in_stack_00000500);
  return EVar1;
}

Assistant:

Error Logging::formatInstruction(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Inst::Detail& detail, const Operand_* opArray, uint32_t opCount) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}